

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O3

void __thiscall
polyscope::SurfaceFaceCountQuantity::SurfaceFaceCountQuantity
          (SurfaceFaceCountQuantity *this,string *name,
          vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
          *values_,SurfaceMesh *mesh_)

{
  _Rb_tree_header *p_Var1;
  pointer *pppVar2;
  pointer pvVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  mapped_type_conflict mVar6;
  pointer pcVar7;
  pointer ppVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pvVar11;
  pointer puVar12;
  pointer puVar13;
  pointer pvVar14;
  iterator __position;
  _Base_ptr p_Var15;
  mapped_type_conflict *pmVar16;
  SurfaceMesh *pSVar17;
  long lVar18;
  key_type_conflict *__k;
  long lVar19;
  _Base_ptr p_Var20;
  _Base_ptr p_Var21;
  _Base_ptr p_Var22;
  pair<unsigned_long,_int> *t;
  pointer ppVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> newValues;
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  m;
  unsigned_long local_d8;
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  *local_d0;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> local_c8;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> *local_a8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  local_a0;
  string local_70;
  string local_50;
  
  pcVar7 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar7,pcVar7 + name->_M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"face count","");
  SurfaceCountQuantity::SurfaceCountQuantity
            (&this->super_SurfaceCountQuantity,&local_50,mesh_,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
  local_d0 = &this->values;
  (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
  super_Quantity<polyscope::SurfaceMesh>._vptr_Quantity =
       (_func_int **)&PTR__SurfaceFaceCountQuantity_004b7de8;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar17 = (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
            super_Quantity<polyscope::SurfaceMesh>.parent;
  if ((pSVar17->facePerm).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pSVar17->facePerm).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    p_Var1 = &local_a0._M_impl.super__Rb_tree_header;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppVar23 = (values_->
              super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVar8 = (values_->
             super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_a8 = values_;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (ppVar23 != ppVar8) {
      do {
        mVar6 = ppVar23->second;
        pmVar16 = std::
                  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                  ::operator[]((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                                *)&local_a0,&ppVar23->first);
        ppVar23 = ppVar23 + 1;
        *pmVar16 = mVar6;
      } while (ppVar23 != ppVar8);
      pSVar17 = (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
                super_Quantity<polyscope::SurfaceMesh>.parent;
    }
    values_ = local_a8;
    local_c8.
    super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8 = 0;
    local_c8.
    super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((pSVar17->faces).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pSVar17->faces).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (local_a0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          __k = (pSVar17->facePerm).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + local_d8;
          uVar9 = *__k;
          p_Var15 = local_a0._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var22 = &p_Var1->_M_header;
          do {
            p_Var21 = p_Var22;
            p_Var20 = p_Var15;
            uVar10 = *(ulong *)(p_Var20 + 1);
            p_Var22 = p_Var20;
            if (uVar10 < uVar9) {
              p_Var22 = p_Var21;
            }
            p_Var15 = (&p_Var20->_M_left)[uVar10 < uVar9];
          } while ((&p_Var20->_M_left)[uVar10 < uVar9] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var22 != p_Var1) {
            if (uVar10 < uVar9) {
              p_Var20 = p_Var21;
            }
            if (*(ulong *)(p_Var20 + 1) <= uVar9) {
              pmVar16 = std::
                        map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                        ::operator[]((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                                      *)&local_a0,__k);
              std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>
              ::emplace_back<unsigned_long&,int&>
                        ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>
                          *)&local_c8,&local_d8,pmVar16);
              pSVar17 = (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
                        super_Quantity<polyscope::SurfaceMesh>.parent;
            }
          }
        }
        local_d8 = local_d8 + 1;
      } while (local_d8 <
               (ulong)(((long)(pSVar17->faces).
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pSVar17->faces).
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
              );
    }
    std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
    operator=(values_,&local_c8);
    if (local_c8.
        super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.
                      super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
    ::~_Rb_tree(&local_a0);
  }
  ppVar23 = (values_->
            super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar8 = (values_->
           super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar23 != ppVar8) {
    do {
      mVar6 = ppVar23->second;
      pmVar16 = std::
                map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                ::operator[](local_d0,&ppVar23->first);
      *pmVar16 = mVar6;
      pSVar17 = (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
                super_Quantity<polyscope::SurfaceMesh>.parent;
      pvVar11 = (pSVar17->faces).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar12 = pvVar11[ppVar23->first].
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar13 = *(pointer *)
                 ((long)&pvVar11[ppVar23->first].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data + 8);
      lVar18 = (long)puVar13 - (long)puVar12 >> 3;
      if (puVar13 == puVar12) {
        auVar26 = ZEXT816(0);
        fVar24 = 0.0;
      }
      else {
        pvVar14 = (pSVar17->vertices).
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        fVar24 = 0.0;
        lVar19 = 0;
        auVar25 = ZEXT816(0);
        do {
          puVar13 = puVar12 + lVar19;
          lVar19 = lVar19 + 1;
          pvVar3 = pvVar14 + *puVar13;
          uVar4 = pvVar3->field_0;
          uVar5 = pvVar3->field_1;
          fVar24 = fVar24 + pvVar14[*puVar13].field_2.z;
          auVar26._0_4_ = auVar25._0_4_ + (float)uVar4;
          auVar26._4_4_ = auVar25._4_4_ + (float)uVar5;
          auVar26._8_4_ = auVar25._8_4_ + 0.0;
          auVar26._12_4_ = auVar25._12_4_ + 0.0;
          auVar25 = auVar26;
        } while (lVar18 + (ulong)(lVar18 == 0) != lVar19);
      }
      auVar25._8_8_ = in_XMM4_Qb;
      auVar25._0_8_ = in_XMM4_Qa;
      auVar25 = vcvtusi2sd_avx512f(auVar25,lVar18);
      fVar27 = (float)auVar25._0_8_;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)(fVar24 / fVar27);
      auVar28._4_4_ = fVar27;
      auVar28._0_4_ = fVar27;
      auVar28._8_4_ = fVar27;
      auVar28._12_4_ = fVar27;
      auVar26 = vdivps_avx(auVar26,auVar28);
      local_a0._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)(double)ppVar23->second;
      local_a0._M_impl._0_8_ = vmovlps_avx(auVar26);
      __position._M_current =
           (this->super_SurfaceCountQuantity).entries.
           super__Vector_base<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super_SurfaceCountQuantity).entries.
          super__Vector_base<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>,std::allocator<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>>>
        ::_M_realloc_insert<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>>
                  ((vector<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>,std::allocator<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>>>
                    *)&(this->super_SurfaceCountQuantity).entries,__position,
                   (pair<glm::vec<3,_float,_(glm::qualifier)0>,_double> *)&local_a0);
      }
      else {
        (__position._M_current)->second =
             (double)local_a0._M_impl.super__Rb_tree_header._M_header._M_parent;
        ((__position._M_current)->first).field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_a0._M_impl._0_4_;
        ((__position._M_current)->first).field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_a0._M_impl._4_4_;
        *(ulong *)&((__position._M_current)->first).field_2 =
             CONCAT44(local_a0._M_impl.super__Rb_tree_header._M_header._4_4_,
                      local_a0._M_impl.super__Rb_tree_header._M_header._M_color);
        pppVar2 = &(this->super_SurfaceCountQuantity).entries.
                   super__Vector_base<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar2 = *pppVar2 + 1;
      }
      ppVar23 = ppVar23 + 1;
    } while (ppVar23 != ppVar8);
  }
  SurfaceCountQuantity::initializeLimits(&this->super_SurfaceCountQuantity);
  return;
}

Assistant:

SurfaceFaceCountQuantity::SurfaceFaceCountQuantity(std::string name, std::vector<std::pair<size_t, int>> values_,
                                                   SurfaceMesh& mesh_)
    : SurfaceCountQuantity(name, mesh_, "face count") {

  // Apply permutation if needed
  if (parent.facePerm.size() > 0) {

    // Build a temporary map to invert
    std::map<size_t, int> m;
    for (auto& t : values_) {
      m[t.first] = t.second;
    }

    // Invert
    std::vector<std::pair<size_t, int>> newValues;
    for (size_t iP = 0; iP < parent.nFaces(); iP++) {
      if (m.find(parent.facePerm[iP]) != m.end()) {
        newValues.emplace_back(iP, m[parent.facePerm[iP]]);
      }
    }

    values_ = newValues;
  }

  for (auto& t : values_) {
    values[t.first] = t.second;

    size_t iF = t.first;
    auto& face = parent.faces[iF];
    size_t D = face.size();
    glm::vec3 faceCenter = glm::vec3{0., 0., 0.};
    for (size_t j = 0; j < D; j++) {
      faceCenter += parent.vertices[face[j]];
    }
    faceCenter /= static_cast<double>(D);

    entries.push_back(std::make_pair(faceCenter, t.second));
  }

  initializeLimits();
}